

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O2

boolean autopickup_match(obj *obj)

{
  nh_bucstatus nVar1;
  boolean bVar2;
  nh_bucstatus nVar3;
  char *pcVar4;
  nh_autopickup_rules *pnVar5;
  int iVar6;
  nh_autopickup_rule *patrn;
  
  nVar3 = B_UNKNOWN;
  if (iflags.ap_rules != (nh_autopickup_rules *)0x0) {
    pcVar4 = doname_price(obj);
    pcVar4 = makesingular(pcVar4);
    nVar1 = *(nh_bucstatus *)&obj->field_0x4a;
    if ((nVar1 & 0x40) != B_UNKNOWN) {
      if ((nVar1 & B_UNCURSED) == B_UNKNOWN) {
        nVar3 = nVar1 & B_BLESSED | B_UNCURSED;
      }
      else {
        nVar3 = B_BLESSED;
      }
    }
    patrn = (iflags.ap_rules)->rules;
    pnVar5 = iflags.ap_rules;
    for (iVar6 = 0; iVar6 < pnVar5->num_rules; iVar6 = iVar6 + 1) {
      if ((((patrn->pattern[0] == '\0') ||
           (bVar2 = pmatch(patrn->pattern,pcVar4), pnVar5 = iflags.ap_rules, bVar2 != '\0')) &&
          ((patrn->oclass == 0x61 || (patrn->oclass == (int)""[obj->oclass])))) &&
         ((patrn->buc == B_DONT_CARE || (patrn->buc == nVar3)))) {
        return patrn->action == AP_GRAB;
      }
      patrn = patrn + 1;
    }
  }
  return '\0';
}

Assistant:

static boolean autopickup_match(struct obj *obj)
{
	int i;
	struct nh_autopickup_rule *r;
	char *objdesc;
	enum nh_bucstatus objbuc;
	
	if (!iflags.ap_rules)
	    return FALSE;
	
	objdesc = makesingular(doname_price(obj));
	if (obj->bknown) {
	    if (obj->blessed)
		objbuc = B_BLESSED;
	    else if (obj->cursed)
		objbuc = B_CURSED;
	    else
		objbuc = B_UNCURSED;
	} else
	    objbuc = B_UNKNOWN;
	
	/* test the aotupickup rules in order. If any of the rules matches this
	 * object, return the result */
	r = &iflags.ap_rules->rules[0];
	for (i = 0; i < iflags.ap_rules->num_rules; i++, r++) {
	    if ((!strlen(r->pattern) || pmatch(r->pattern, objdesc)) &&
		(r->oclass == OCLASS_ANY || r->oclass == def_oc_syms[(int)obj->oclass]) &&
		(r->buc == B_DONT_CARE || r->buc == objbuc))
		return r->action == AP_GRAB;
	}
	return FALSE;
}